

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

long __thiscall
cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
::fill_internal_output
          (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
           *this,float *input_buffer,long *input_frames_count,float *output_buffer,
          long output_frames_needed)

{
  uint32_t uVar1;
  ulong frame_count;
  size_t sVar2;
  long in_RDI;
  cubeb_resampler_speex_one_way<float> *in_R8;
  long output_frames_before_processing;
  float *out_unprocessed;
  long got;
  cubeb_resampler_speex_one_way<float> *in_stack_ffffffffffffffc0;
  cubeb_resampler_speex_one_way<float> *this_00;
  float *in_stack_ffffffffffffffc8;
  cubeb_resampler_speex_one_way<float> *this_01;
  
  if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
    this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
    this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
    std::
    unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                  *)0x119dfa);
    uVar1 = cubeb_resampler_speex_one_way<float>::input_needed_for_output
                      (this_01,(int32_t)((ulong)this_00 >> 0x20));
    frame_count = (ulong)uVar1;
    std::
    unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                  *)0x119e1e);
    in_stack_ffffffffffffffc0 =
         (cubeb_resampler_speex_one_way<float> *)
         cubeb_resampler_speex_one_way<float>::input_buffer(this_00,frame_count);
    in_stack_ffffffffffffffc8 =
         (float *)(**(code **)(in_RDI + 0x30))
                            (*(undefined8 *)(in_RDI + 0x28),*(undefined8 *)(in_RDI + 0x38),0,
                             in_stack_ffffffffffffffc0,frame_count);
    if (((long)in_stack_ffffffffffffffc8 < (long)frame_count) &&
       (*(undefined1 *)(in_RDI + 0x40) = 1, (long)in_stack_ffffffffffffffc8 < 0)) {
      return (long)in_stack_ffffffffffffffc8;
    }
    std::
    unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                  *)0x119e8d);
    cubeb_resampler_speex_one_way<float>::written(in_stack_ffffffffffffffc0,frame_count);
  }
  std::
  unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
  ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                *)0x119ea8);
  sVar2 = cubeb_resampler_speex_one_way<float>::output
                    (in_R8,in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
  return sVar2;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_output(
    T * input_buffer, long * input_frames_count, T * output_buffer,
    long output_frames_needed)
{
  assert(!input_buffer && (!input_frames_count || *input_frames_count == 0) &&
         output_buffer && output_frames_needed);

  if (!draining) {
    long got = 0;
    T * out_unprocessed = nullptr;
    long output_frames_before_processing = 0;

    /* fill directly the input buffer of the output processor to save a copy */
    output_frames_before_processing =
        output_processor->input_needed_for_output(output_frames_needed);

    out_unprocessed =
        output_processor->input_buffer(output_frames_before_processing);

    got = data_callback(stream, user_ptr, nullptr, out_unprocessed,
                        output_frames_before_processing);

    if (got < output_frames_before_processing) {
      draining = true;

      if (got < 0) {
        return got;
      }
    }

    output_processor->written(got);
  }

  /* Process the output. If not enough frames have been returned from the
   * callback, drain the processors. */
  return output_processor->output(output_buffer, output_frames_needed);
}